

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O3

string * __thiscall
bloaty::macho::MachOObjectFile::GetBuildId_abi_cxx11_
          (string *__return_storage_ptr__,MachOObjectFile *this)

{
  anon_class_8_1_3fcf65d9 local_20;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_20.id = __return_storage_ptr__;
  ForEachLoadCommand<bloaty::macho::MachOObjectFile::GetBuildId[abi:cxx11]()const::_lambda(bloaty::macho::LoadCommand)_1_>
            (((this->super_ObjectFile).file_data_._M_t.
              super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>._M_t
              .super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
              super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl)->data_,
             (RangeSink *)0x0,&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string GetBuildId() const override {
    std::string id;

    ForEachLoadCommand(file_data().data(), nullptr, [&id](LoadCommand cmd) {
      if (cmd.cmd == LC_UUID) {
        auto uuid_cmd =
            GetStructPointerAndAdvance<uuid_command>(&cmd.command_data);
        if (!cmd.command_data.empty()) {
          THROWF("Unexpected excess uuid data: $0", cmd.command_data.size());
        }
        id.resize(sizeof(uuid_cmd->uuid));
        memcpy(&id[0], &uuid_cmd->uuid[0], sizeof(uuid_cmd->uuid));
      }
    });

    return id;
  }